

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  time_t tVar4;
  uint local_58;
  long local_50;
  long local_48;
  char otp [13];
  
  iVar3 = 0x1e;
  bVar1 = true;
  local_58 = 8;
  local_50 = 0;
  while (iVar2 = getopt(argc,argv,"hl:t:T:"), iVar2 != -1) {
    switch(iVar2 << 0x1e | iVar2 - 0x54U >> 2) {
    case 0:
      iVar3 = atoi(_optarg);
      break;
    default:
      goto switchD_00101217_caseD_1;
    case 5:
      print_usage(_stdout,*argv);
      return 0;
    case 6:
      local_58 = atoi(_optarg);
      if (0xc < (int)local_58) {
        fprintf(_stderr,"Password length %d exceeds maximum of %d",(ulong)local_58,0xc);
        return 1;
      }
      break;
    case 8:
      local_50 = atol(_optarg);
      bVar1 = false;
    }
  }
  local_48 = local_50;
  if (_optind + 1 == argc) {
    if ((bVar1) && (tVar4 = time(&local_48), tVar4 == -1)) {
      perror("time");
      return -1;
    }
    mtotp_totp(argv[_optind],local_48,iVar3,local_58,otp);
    puts(otp);
    return 0;
  }
switchD_00101217_caseD_1:
  print_usage((FILE *)_stderr,*argv);
  return 1;
}

Assistant:

int main(int argc, char **argv) {
  time_t now = 0;
  char otp[OTP_MAX_LENGTH + 1];
  int otp_length = OTP_DEFAULT_LENGTH;
  int opt;
  int tfnd = 0;
  int time_step = TIME_STEP_DEFAULT;

  while ((opt = getopt(argc, argv, "hl:t:T:")) != -1) {
    switch (opt) {
    case 'h':
      print_usage(stdout, argv[0]);
      return 0;
    case 'l':
      otp_length = atoi(optarg);
      if (otp_length > OTP_MAX_LENGTH) {
        fprintf(stderr, "Password length %d exceeds maximum of %d", otp_length,
                OTP_MAX_LENGTH);
        return 1;
      }
      break;
    case 't':
      now = atol(optarg);
      tfnd = 1;
      break;
    case 'T':
      time_step = atoi(optarg);
      break;
    default:
      print_usage(stderr, argv[0]);
      return 1;
    }
  }

  if (optind + 1 != argc) {
    print_usage(stderr, argv[0]);
    return 1;
  }

  if (!tfnd && time(&now) == -1) {
    perror("time");
    return -1;
  }

  mtotp_totp(argv[optind], now, time_step, otp_length, otp);
  printf("%s\n", otp);
  return 0;
}